

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

void ReadSigNetArgs(ArgsManager *args,SigNetOptions *options)

{
  long lVar1;
  bool bVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  long in_FS_OFFSET;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  signet_challenge;
  string local_68;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> val;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,"-signetseednode",(allocator<char> *)&local_68);
  bVar2 = ArgsManager::IsArgSet(args,(string *)&val);
  std::__cxx11::string::~string((string *)&val);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&val,"-signetseednode",(allocator<char> *)&signet_challenge);
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68,args,(string *)&val);
    std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
    emplace<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
               &options->seeds,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_68);
    std::__cxx11::string::~string((string *)&val);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,"-signetchallenge",(allocator<char> *)&local_68);
  bVar2 = ArgsManager::IsArgSet(args,(string *)&val);
  std::__cxx11::string::~string((string *)&val);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&val,"-signetchallenge",(allocator<char> *)&local_68);
    ArgsManager::GetArgs(&signet_challenge,args,(string *)&val);
    std::__cxx11::string::~string((string *)&val);
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)signet_challenge.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)signet_challenge.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if (args_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"-signetchallenge cannot be multiple values.");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_002b8971;
    }
    str._M_str = ((signet_challenge.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    str._M_len = (signet_challenge.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    TryParseHex<unsigned_char>(&val,str);
    if (val.
        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
        _M_engaged == false) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                (&local_68,(tinyformat *)"-signetchallenge must be hex, not \'%s\'.",
                 (char *)signet_challenge.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,args_00);
      std::runtime_error::runtime_error(prVar3,(string *)&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_002b8971;
    }
    std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
    emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
              ((optional<std::vector<unsigned_char,std::allocator<unsigned_char>>> *)options,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val);
    std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&signet_challenge);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_002b8971:
  __stack_chk_fail();
}

Assistant:

void ReadSigNetArgs(const ArgsManager& args, CChainParams::SigNetOptions& options)
{
    if (args.IsArgSet("-signetseednode")) {
        options.seeds.emplace(args.GetArgs("-signetseednode"));
    }
    if (args.IsArgSet("-signetchallenge")) {
        const auto signet_challenge = args.GetArgs("-signetchallenge");
        if (signet_challenge.size() != 1) {
            throw std::runtime_error("-signetchallenge cannot be multiple values.");
        }
        const auto val{TryParseHex<uint8_t>(signet_challenge[0])};
        if (!val) {
            throw std::runtime_error(strprintf("-signetchallenge must be hex, not '%s'.", signet_challenge[0]));
        }
        options.challenge.emplace(*val);
    }
}